

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<double,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,double *x,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference pvVar4;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R9;
  double dVar5;
  double dVar6;
  size_t row;
  double w_this;
  double n_prev;
  double out;
  double n;
  double diff;
  double delta_div;
  double delta_s;
  double delta;
  double M4;
  double M3;
  double M2;
  double m;
  double local_b8;
  byte local_a1;
  ulong local_a0;
  double in_stack_ffffffffffffff68;
  double *x_00;
  size_t in_stack_ffffffffffffff78;
  double *st_00;
  size_t *in_stack_ffffffffffffff88;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_8;
  
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  local_58 = 0.0;
  st_00 = (double *)0x0;
  x_00 = (double *)0x0;
  for (local_a0 = in_RSI; local_a0 <= in_RDX; local_a0 = local_a0 + 1) {
    uVar2 = std::isnan(*(double *)(in_RCX + *(long *)(in_RDI + local_a0 * 8) * 8));
    local_a1 = 1;
    if ((uVar2 & 1) == 0) {
      iVar3 = std::isinf(*(double *)(in_RCX + *(long *)(in_RDI + local_a0 * 8) * 8));
      local_a1 = (byte)iVar3;
    }
    if (((local_a1 ^ 0xff) & 1) != 0) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_R9,*(size_type *)(in_RDI + local_a0 * 8));
      in_stack_ffffffffffffff68 = *pvVar4;
      st_00 = (double *)(in_stack_ffffffffffffff68 + (double)st_00);
      dVar5 = *(double *)(in_RCX + *(long *)(in_RDI + local_a0 * 8) * 8) - local_40;
      dVar6 = dVar5 / (double)st_00;
      in_stack_ffffffffffffff88 = (size_t *)(dVar5 * dVar6 * (double)x_00);
      local_40 = in_stack_ffffffffffffff68 * dVar6 + local_40;
      local_58 = in_stack_ffffffffffffff68 *
                 (-(dVar6 * 4.0) * local_50 +
                 (double)in_stack_ffffffffffffff88 * dVar6 * dVar6 *
                 ((double)st_00 * (double)st_00 + -((double)st_00 * 3.0) + 3.0) +
                 dVar6 * dVar6 * 6.0 * local_48) + local_58;
      local_50 = in_stack_ffffffffffffff68 *
                 ((double)in_stack_ffffffffffffff88 * dVar6 * ((double)st_00 - 2.0) +
                 -(dVar6 * 3.0 * local_48)) + local_50;
      local_48 = in_stack_ffffffffffffff68 * (double)in_stack_ffffffffffffff88 + local_48;
      x_00 = st_00;
    }
  }
  if ((double)st_00 <= 0.0) {
    local_8 = -INFINITY;
  }
  else {
    uVar2 = std::isnan(local_48);
    bVar1 = false;
    if ((uVar2 & 1) == 0) {
      uVar2 = std::isinf(local_48);
      bVar1 = false;
      if ((uVar2 & 1) == 0) {
        dVar5 = std::numeric_limits<double>::epsilon();
        bVar1 = local_48 <= dVar5;
      }
    }
    if ((!bVar1) ||
       (bVar1 = check_more_than_two_unique_values<double>
                          (in_stack_ffffffffffffff88,(size_t)st_00,in_stack_ffffffffffffff78,x_00,
                           (MissingAction)((ulong)in_stack_ffffffffffffff68 >> 0x20)), bVar1)) {
      local_b8 = (local_58 / local_48) * ((double)st_00 / local_48);
      uVar2 = std::isnan(local_b8);
      if (((uVar2 & 1) == 0) && (uVar2 = std::isinf(local_b8), (uVar2 & 1) == 0)) {
        if (local_b8 <= 0.0) {
          local_b8 = 0.0;
        }
      }
      else {
        local_b8 = -INFINITY;
      }
      local_8 = local_b8;
    }
    else {
      local_8 = -INFINITY;
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(size_t ix_arr[], size_t st, size_t end, real_t x[],
                              MissingAction missing_action, mapping &restrict w)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff;
    ldouble_safe n = 0;
    ldouble_safe out;
    ldouble_safe n_prev = 0.;
    ldouble_safe w_this;

    for (size_t row = st; row <= end; row++)
    {
        if (likely(!is_na_or_inf(x[ix_arr[row]])))
        {
            w_this = w[ix_arr[row]];
            n += w_this;

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * n_prev);
            n_prev     =  n;

            m   +=  w_this * (delta_div);
            M4  +=  w_this * (diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3);
            M3  +=  w_this * (diff * delta_div * (n - 2) - 3 * delta_div * M2);
            M2  +=  w_this * (diff);
        }
    }

    if (unlikely(n <= 0)) return -HUGE_VAL;
    if (unlikely(!is_na_or_inf(M2) && M2 <= std::numeric_limits<double>::epsilon()))
    {
        if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
            return -HUGE_VAL;
    }

    out = ( M4 / M2 ) * ( n / M2 );
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}